

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mersennetwister.h
# Opt level: O0

void __thiscall MTRand::seed(MTRand *this,uint32 *bigSeed,uint32 seedLength)

{
  int local_44;
  int local_34;
  ulong uStack_30;
  int k;
  uint32 j;
  int i;
  uint32 seedLength_local;
  uint32 *bigSeed_local;
  MTRand *this_local;
  
  initialize(this,0x12bd6aa);
  j._4_4_ = 1;
  uStack_30 = 0;
  if (seedLength < 0x270) {
    local_44 = 0x270;
  }
  else {
    local_44 = (int)seedLength;
  }
  for (local_34 = local_44; local_34 != 0; local_34 = local_34 + -1) {
    this->state[j._4_4_] =
         this->state[j._4_4_] ^
         (this->state[j._4_4_ + -1] ^ this->state[j._4_4_ + -1] >> 0x1e) * 0x19660d;
    this->state[j._4_4_] = (bigSeed[uStack_30] & 0xffffffff) + uStack_30 + this->state[j._4_4_];
    this->state[j._4_4_] = this->state[j._4_4_] & 0xffffffff;
    j._4_4_ = j._4_4_ + 1;
    uStack_30 = uStack_30 + 1;
    if (0x26f < j._4_4_) {
      this->state[0] = this->state[0x26f];
      j._4_4_ = 1;
    }
    if (seedLength <= uStack_30) {
      uStack_30 = 0;
    }
  }
  for (local_34 = 0x26f; local_34 != 0; local_34 = local_34 + -1) {
    this->state[j._4_4_] =
         this->state[j._4_4_] ^
         (this->state[j._4_4_ + -1] ^ this->state[j._4_4_ + -1] >> 0x1e) * 0x5d588b65;
    this->state[j._4_4_] = this->state[j._4_4_] - (long)j._4_4_;
    this->state[j._4_4_] = this->state[j._4_4_] & 0xffffffff;
    j._4_4_ = j._4_4_ + 1;
    if (0x26f < j._4_4_) {
      this->state[0] = this->state[0x26f];
      j._4_4_ = 1;
    }
  }
  this->state[0] = 0x80000000;
  reload(this);
  return;
}

Assistant:

void MTRand::seed(uint32 *const bigSeed, const uint32 seedLength) {
  // Seed the generator with an array of uint32's
  // There are 2^19937-1 possible initial states.  This function allows
  // all of those to be accessed by providing at least 19937 bits (with a
  // default seed length of N = 624 uint32's).  Any bits above the lower 32
  // in each element are discarded.
  // Just call seed() if you want to get array from /dev/urandom
  initialize(19650218UL);
  int i = 1;
  uint32 j = 0;
  int k = (uint32(N) > seedLength ? int(N) : int(seedLength));
  for (; k; --k) {
    state[i] = state[i] ^ ((state[i - 1] ^ (state[i - 1] >> 30)) * 1664525UL);
    state[i] += (bigSeed[j] & 0xffffffffUL) + j;
    state[i] &= 0xffffffffUL;
    ++i;
    ++j;
    if (i >= N) {
      state[0] = state[N - 1];
      i = 1;
    }
    if (j >= seedLength)
      j = 0;
  }
  for (k = N - 1; k; --k) {
    state[i] =
        state[i] ^ ((state[i - 1] ^ (state[i - 1] >> 30)) * 1566083941UL);
    state[i] -= i;
    state[i] &= 0xffffffffUL;
    ++i;
    if (i >= N) {
      state[0] = state[N - 1];
      i = 1;
    }
  }
  state[0] = 0x80000000UL; // MSB is 1, assuring non-zero initial array
  reload();
}